

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::lts_20250127::debugging_internal::ParseDiscriminator(State *state)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  ParseState copy;
  
  iVar5 = state->recursion_depth;
  iVar1 = state->steps;
  state->recursion_depth = iVar5 + 1;
  state->steps = iVar1 + 1;
  if (0x1ffff < iVar1 || 0xff < iVar5) goto LAB_00380c37;
  iVar5 = (state->parse_state).mangled_idx;
  iVar1 = (state->parse_state).out_cur_idx;
  iVar2 = (state->parse_state).prev_name_idx;
  uVar3 = *(undefined4 *)&(state->parse_state).field_0xc;
  bVar4 = ParseOneCharToken(state,'_');
  if (bVar4) {
    bVar4 = ParseCharClass(state,"0123456789");
    if (!bVar4) {
      bVar4 = ParseOneCharToken(state,'_');
      if (bVar4) {
        bVar4 = ParseNumber(state,(int *)0x0);
        if (bVar4) {
          bVar4 = ParseOneCharToken(state,'_');
          if (bVar4) goto LAB_00380c32;
        }
      }
      (state->parse_state).mangled_idx = iVar5;
      (state->parse_state).out_cur_idx = iVar1;
      (state->parse_state).prev_name_idx = iVar2;
      *(undefined4 *)&(state->parse_state).field_0xc = uVar3;
    }
  }
LAB_00380c32:
  iVar5 = state->recursion_depth + -1;
LAB_00380c37:
  state->recursion_depth = iVar5;
  return SUB41(iVar5,0);
}

Assistant:

static bool ParseDiscriminator(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  // Both forms start with _ so parse that first.
  if (!ParseOneCharToken(state, '_')) return false;

  // <digit>
  if (ParseDigit(state, nullptr)) return true;

  // _ <number> _
  if (ParseOneCharToken(state, '_') && ParseNumber(state, nullptr) &&
      ParseOneCharToken(state, '_')) {
    return true;
  }
  state->parse_state = copy;
  return false;
}